

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

char * luaX_token2str(LexState *ls,int token)

{
  ushort **ppuVar1;
  LexState *local_28;
  int token_local;
  LexState *ls_local;
  
  if (token < 0x101) {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[token] & 2) == 0) {
      local_28 = (LexState *)luaO_pushfstring(ls->L,"%c",(ulong)(uint)token);
    }
    else {
      local_28 = (LexState *)luaO_pushfstring(ls->L,"char(%d)",(ulong)(uint)token);
    }
    ls_local = local_28;
  }
  else {
    ls_local = (LexState *)luaX_tokens[token + -0x101];
  }
  return (char *)ls_local;
}

Assistant:

static const char*luaX_token2str(LexState*ls,int token){
if(token<257){
return(iscntrl(token))?luaO_pushfstring(ls->L,"char(%d)",token):
luaO_pushfstring(ls->L,"%c",token);
}
else
return luaX_tokens[token-257];
}